

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 uVar5;
  ulong uVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 (*pauVar64) [16];
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  ulong uVar68;
  GridSOA *pGVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  char *pcVar73;
  Geometry *pGVar74;
  ulong uVar75;
  undefined1 (*pauVar76) [16];
  float fVar77;
  float fVar86;
  float fVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  float fVar88;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [32];
  float fVar107;
  float fVar115;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar110 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  float fVar135;
  undefined1 auVar133 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar171;
  undefined1 auVar166 [16];
  float fVar165;
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar175;
  float fVar182;
  float fVar185;
  undefined1 auVar178 [16];
  float fVar176;
  float fVar177;
  float fVar183;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar179 [16];
  float fVar191;
  float fVar194;
  float fVar197;
  undefined1 auVar180 [32];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  undefined1 auVar181 [32];
  undefined1 auVar200 [16];
  float fVar201;
  float fVar204;
  float fVar205;
  undefined1 auVar202 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar203 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  char *local_13f8;
  ulong local_13f0;
  ulong local_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 (*local_1358) [16];
  RTCFilterFunctionNArguments local_1350;
  Geometry *local_1320;
  undefined1 auStack_1318 [24];
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 auStack_12d0 [16];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  char **local_1240;
  undefined1 local_1220 [32];
  float local_1200 [4];
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined4 local_1130;
  undefined4 uStack_112c;
  undefined4 uStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [16];
  undefined4 local_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float local_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined1 local_10d0 [16];
  uint local_10c0;
  uint uStack_10bc;
  uint uStack_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  uint uStack_10a8;
  uint uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar152 [16];
  undefined1 auVar153 [24];
  undefined1 auVar154 [32];
  
  pauVar76 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1380._4_4_ = uVar1;
  local_1380._0_4_ = uVar1;
  local_1380._8_4_ = uVar1;
  local_1380._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar200._4_4_ = uVar1;
  auVar200._0_4_ = uVar1;
  auVar200._8_4_ = uVar1;
  auVar200._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar202._4_4_ = uVar1;
  auVar202._0_4_ = uVar1;
  auVar202._8_4_ = uVar1;
  auVar202._12_4_ = uVar1;
  fVar77 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar128 = ZEXT416((uint)(fVar77 * 0.99999964));
  auVar128 = vshufps_avx(auVar128,auVar128,0);
  auVar129 = ZEXT416((uint)(fVar86 * 0.99999964));
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar133 = ZEXT1664(local_1380);
  auVar108 = ZEXT416((uint)(fVar87 * 0.99999964));
  auVar108 = vshufps_avx(auVar108,auVar108,0);
  auVar78 = ZEXT416((uint)(fVar77 * 1.0000004));
  auVar78 = vshufps_avx(auVar78,auVar78,0);
  auVar79 = ZEXT416((uint)(fVar86 * 1.0000004));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar80 = ZEXT416((uint)(fVar87 * 1.0000004));
  auVar80 = vshufps_avx(auVar80,auVar80,0);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  auVar178._4_4_ = iVar2;
  auVar178._0_4_ = iVar2;
  auVar178._8_4_ = iVar2;
  auVar178._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar85 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1358 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00f11f8b:
  do {
    do {
      if (pauVar76 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar64 = pauVar76 + -1;
      pauVar76 = pauVar76 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar64 + 8));
    uVar68 = *(ulong *)*pauVar76;
    while ((uVar68 & 8) == 0) {
      auVar143 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar75),auVar133._0_16_);
      auVar92._0_4_ = auVar128._0_4_ * auVar143._0_4_;
      auVar92._4_4_ = auVar128._4_4_ * auVar143._4_4_;
      auVar92._8_4_ = auVar128._8_4_ * auVar143._8_4_;
      auVar92._12_4_ = auVar128._12_4_ * auVar143._12_4_;
      auVar143 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar72),auVar200);
      auVar100._0_4_ = auVar129._0_4_ * auVar143._0_4_;
      auVar100._4_4_ = auVar129._4_4_ * auVar143._4_4_;
      auVar100._8_4_ = auVar129._8_4_ * auVar143._8_4_;
      auVar100._12_4_ = auVar129._12_4_ * auVar143._12_4_;
      auVar143 = vmaxps_avx(auVar92,auVar100);
      auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar71),auVar202);
      auVar101._0_4_ = auVar108._0_4_ * auVar92._0_4_;
      auVar101._4_4_ = auVar108._4_4_ * auVar92._4_4_;
      auVar101._8_4_ = auVar108._8_4_ * auVar92._8_4_;
      auVar101._12_4_ = auVar108._12_4_ * auVar92._12_4_;
      auVar92 = vmaxps_avx(auVar101,auVar178);
      auVar92 = vmaxps_avx(auVar143,auVar92);
      auVar143 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar75 ^ 0x10)),auVar133._0_16_)
      ;
      auVar166._0_4_ = auVar78._0_4_ * auVar143._0_4_;
      auVar166._4_4_ = auVar78._4_4_ * auVar143._4_4_;
      auVar166._8_4_ = auVar78._8_4_ * auVar143._8_4_;
      auVar166._12_4_ = auVar78._12_4_ * auVar143._12_4_;
      auVar143 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar72 ^ 0x10)),auVar200);
      auVar109._0_4_ = auVar79._0_4_ * auVar143._0_4_;
      auVar109._4_4_ = auVar79._4_4_ * auVar143._4_4_;
      auVar109._8_4_ = auVar79._8_4_ * auVar143._8_4_;
      auVar109._12_4_ = auVar79._12_4_ * auVar143._12_4_;
      auVar143 = vminps_avx(auVar166,auVar109);
      auVar100 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar71 ^ 0x10)),auVar202);
      auVar179._0_4_ = auVar80._0_4_ * auVar100._0_4_;
      auVar179._4_4_ = auVar80._4_4_ * auVar100._4_4_;
      auVar179._8_4_ = auVar80._8_4_ * auVar100._8_4_;
      auVar179._12_4_ = auVar80._12_4_ * auVar100._12_4_;
      auVar100 = vminps_avx(auVar179,auVar85._0_16_);
      auVar143 = vminps_avx(auVar143,auVar100);
      auVar143 = vcmpps_avx(auVar92,auVar143,2);
      uVar65 = vmovmskps_avx(auVar143);
      local_12a0._0_16_ = auVar92;
      if (uVar65 == 0) goto LAB_00f11f8b;
      uVar65 = uVar65 & 0xff;
      uVar67 = uVar68 & 0xfffffffffffffff0;
      lVar8 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
        }
      }
      uVar68 = *(ulong *)(uVar67 + lVar8 * 8);
      uVar65 = uVar65 - 1 & uVar65;
      if (uVar65 != 0) {
        uVar66 = *(uint *)(local_12a0 + lVar8 * 4);
        lVar8 = 0;
        if (uVar65 != 0) {
          for (; (uVar65 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar6 = *(ulong *)(uVar67 + lVar8 * 8);
        uVar4 = *(uint *)(local_12a0 + lVar8 * 4);
        uVar65 = uVar65 - 1 & uVar65;
        if (uVar65 == 0) {
          if (uVar66 < uVar4) {
            *(ulong *)*pauVar76 = uVar6;
            *(uint *)(*pauVar76 + 8) = uVar4;
            pauVar76 = pauVar76 + 1;
          }
          else {
            *(ulong *)*pauVar76 = uVar68;
            *(uint *)(*pauVar76 + 8) = uVar66;
            uVar68 = uVar6;
            pauVar76 = pauVar76 + 1;
          }
        }
        else {
          auVar143._8_8_ = 0;
          auVar143._0_8_ = uVar68;
          auVar143 = vpunpcklqdq_avx(auVar143,ZEXT416(uVar66));
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar6;
          auVar92 = vpunpcklqdq_avx(auVar102,ZEXT416(uVar4));
          lVar8 = 0;
          if (uVar65 != 0) {
            for (; (uVar65 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(uVar67 + lVar8 * 8);
          auVar101 = vpunpcklqdq_avx(auVar110,ZEXT416(*(uint *)(local_12a0 + lVar8 * 4)));
          auVar100 = vpcmpgtd_avx(auVar92,auVar143);
          uVar65 = uVar65 - 1 & uVar65;
          if (uVar65 == 0) {
            auVar166 = vpshufd_avx(auVar100,0xaa);
            auVar100 = vblendvps_avx(auVar92,auVar143,auVar166);
            auVar143 = vblendvps_avx(auVar143,auVar92,auVar166);
            auVar92 = vpcmpgtd_avx(auVar101,auVar100);
            auVar166 = vpshufd_avx(auVar92,0xaa);
            auVar92 = vblendvps_avx(auVar101,auVar100,auVar166);
            auVar100 = vblendvps_avx(auVar100,auVar101,auVar166);
            auVar101 = vpcmpgtd_avx(auVar100,auVar143);
            auVar166 = vpshufd_avx(auVar101,0xaa);
            auVar101 = vblendvps_avx(auVar100,auVar143,auVar166);
            auVar143 = vblendvps_avx(auVar143,auVar100,auVar166);
            *pauVar76 = auVar143;
            pauVar76[1] = auVar101;
            uVar68 = auVar92._0_8_;
            pauVar76 = pauVar76 + 2;
          }
          else {
            lVar8 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            auVar136._8_8_ = 0;
            auVar136._0_8_ = *(ulong *)(uVar67 + lVar8 * 8);
            auVar109 = vpunpcklqdq_avx(auVar136,ZEXT416(*(uint *)(local_12a0 + lVar8 * 4)));
            auVar166 = vpshufd_avx(auVar100,0xaa);
            auVar100 = vblendvps_avx(auVar92,auVar143,auVar166);
            auVar143 = vblendvps_avx(auVar143,auVar92,auVar166);
            auVar92 = vpcmpgtd_avx(auVar109,auVar101);
            auVar166 = vpshufd_avx(auVar92,0xaa);
            auVar92 = vblendvps_avx(auVar109,auVar101,auVar166);
            auVar101 = vblendvps_avx(auVar101,auVar109,auVar166);
            auVar166 = vpcmpgtd_avx(auVar101,auVar143);
            auVar109 = vpshufd_avx(auVar166,0xaa);
            auVar166 = vblendvps_avx(auVar101,auVar143,auVar109);
            auVar143 = vblendvps_avx(auVar143,auVar101,auVar109);
            auVar101 = vpcmpgtd_avx(auVar92,auVar100);
            auVar109 = vpshufd_avx(auVar101,0xaa);
            auVar101 = vblendvps_avx(auVar92,auVar100,auVar109);
            auVar92 = vblendvps_avx(auVar100,auVar92,auVar109);
            auVar100 = vpcmpgtd_avx(auVar166,auVar92);
            auVar109 = vpshufd_avx(auVar100,0xaa);
            auVar100 = vblendvps_avx(auVar166,auVar92,auVar109);
            auVar92 = vblendvps_avx(auVar92,auVar166,auVar109);
            *pauVar76 = auVar143;
            pauVar76[1] = auVar92;
            pauVar76[2] = auVar100;
            uVar68 = auVar101._0_8_;
            pauVar76 = pauVar76 + 3;
          }
          auVar133 = ZEXT1664(local_1380);
        }
      }
    }
    if (((uint)uVar68 & 0xf) == 8) {
      pGVar69 = (pre->super_Precalculations).grid;
      uVar65 = pGVar69->width;
      local_13f0 = (ulong)uVar65;
      uVar66 = pGVar69->height;
      local_13e8 = (ulong)uVar66;
      uVar4 = pGVar69->gridOffset;
      uVar68 = uVar68 >> 4;
      lVar8 = uVar68 * 4 + (ulong)uVar4;
      auVar143 = *(undefined1 (*) [16])(pGVar69->data + local_13f0 * 4 + lVar8 + -4);
      auVar92 = auVar143;
      if (2 < local_13e8) {
        auVar92 = *(undefined1 (*) [16])
                   (pGVar69->data + local_13f0 * 8 + uVar68 * 4 + (ulong)uVar4 + -4);
      }
      auVar100 = *(undefined1 (*) [16])(pGVar69->data + uVar68 * 4 + (ulong)uVar4 + -4);
      if (local_13f0 == 2) {
        auVar100 = vshufps_avx(auVar100,auVar100,0x54);
        auVar143 = vshufps_avx(auVar143,auVar143,0x54);
        auVar92 = vshufps_avx(auVar92,auVar92,0x54);
      }
      uVar68 = (ulong)pGVar69->dim_offset;
      pcVar73 = pGVar69->data + uVar68 * 4 + lVar8 + -4;
      auVar101 = *(undefined1 (*) [16])(pcVar73 + local_13f0 * 4);
      auVar166 = auVar101;
      if (2 < uVar66) {
        auVar166 = *(undefined1 (*) [16])(pcVar73 + local_13f0 * 8);
      }
      auVar109 = *(undefined1 (*) [16])pcVar73;
      if (uVar65 == 2) {
        auVar109 = vshufps_avx(auVar109,auVar109,0x54);
        auVar101 = vshufps_avx(auVar101,auVar101,0x54);
        auVar166 = vshufps_avx(auVar166,auVar166,0x54);
      }
      pcVar73 = pGVar69->data + uVar68 * 8 + lVar8 + -4;
      auVar179 = *(undefined1 (*) [16])(pcVar73 + local_13f0 * 4);
      auVar102 = auVar179;
      if (2 < uVar66) {
        auVar102 = *(undefined1 (*) [16])(pcVar73 + local_13f0 * 8);
      }
      auVar146._16_16_ = auVar143;
      auVar146._0_16_ = auVar100;
      auVar81._16_16_ = auVar92;
      auVar81._0_16_ = auVar143;
      auVar84 = vunpcklps_avx(auVar146,auVar81);
      auVar146 = vshufps_avx(auVar146,auVar146,0xa5);
      auVar81 = vshufps_avx(auVar81,auVar81,0x94);
      auVar144._16_16_ = auVar101;
      auVar144._0_16_ = auVar109;
      auVar130._16_16_ = auVar166;
      auVar130._0_16_ = auVar101;
      auVar97 = vunpcklps_avx(auVar144,auVar130);
      auVar144 = vshufps_avx(auVar144,auVar144,0xa5);
      auVar130 = vshufps_avx(auVar130,auVar130,0x94);
      auVar143 = *(undefined1 (*) [16])pcVar73;
      if (uVar65 == 2) {
        auVar143 = vshufps_avx(auVar143,auVar143,0x54);
        auVar179 = vshufps_avx(auVar179,auVar179,0x54);
        auVar102 = vshufps_avx(auVar102,auVar102,0x54);
      }
      local_13f8 = pGVar69->data + uVar68 * 0xc + lVar8 + -4;
      auVar131._16_16_ = auVar179;
      auVar131._0_16_ = auVar143;
      auVar137._16_16_ = auVar102;
      auVar137._0_16_ = auVar179;
      auVar34 = vunpcklps_avx(auVar131,auVar137);
      auVar29 = vshufps_avx(auVar131,auVar131,0xa5);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar167._4_4_ = uVar1;
      auVar167._0_4_ = uVar1;
      auVar167._8_4_ = uVar1;
      auVar167._12_4_ = uVar1;
      auVar167._16_4_ = uVar1;
      auVar167._20_4_ = uVar1;
      auVar167._24_4_ = uVar1;
      auVar167._28_4_ = uVar1;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar180._4_4_ = uVar3;
      auVar180._0_4_ = uVar3;
      auVar180._8_4_ = uVar3;
      auVar180._12_4_ = uVar3;
      auVar180._16_4_ = uVar3;
      auVar180._20_4_ = uVar3;
      auVar180._24_4_ = uVar3;
      auVar180._28_4_ = uVar3;
      auVar30 = vshufps_avx(auVar137,auVar137,0x94);
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar203._4_4_ = uVar3;
      auVar203._0_4_ = uVar3;
      auVar203._8_4_ = uVar3;
      auVar203._12_4_ = uVar3;
      auVar203._16_4_ = uVar3;
      auVar203._20_4_ = uVar3;
      auVar203._24_4_ = uVar3;
      auVar203._28_4_ = uVar3;
      auVar84 = vsubps_avx(auVar84,auVar167);
      auVar97 = vsubps_avx(auVar97,auVar180);
      auVar34 = vsubps_avx(auVar34,auVar203);
      auVar146 = vsubps_avx(auVar146,auVar167);
      auVar144 = vsubps_avx(auVar144,auVar180);
      auVar29 = vsubps_avx(auVar29,auVar203);
      auVar81 = vsubps_avx(auVar81,auVar167);
      auVar130 = vsubps_avx(auVar130,auVar180);
      auVar31 = vsubps_avx(auVar30,auVar203);
      local_fc0 = vsubps_avx(auVar81,auVar84);
      local_fe0 = vsubps_avx(auVar130,auVar97);
      local_1000 = vsubps_avx(auVar31,auVar34);
      fVar9 = auVar97._0_4_;
      fVar77 = auVar130._0_4_ + fVar9;
      fVar12 = auVar97._4_4_;
      fVar86 = auVar130._4_4_ + fVar12;
      fVar120 = auVar97._8_4_;
      fVar87 = auVar130._8_4_ + fVar120;
      fVar126 = auVar97._12_4_;
      fVar88 = auVar130._12_4_ + fVar126;
      fVar15 = auVar97._16_4_;
      fVar89 = auVar130._16_4_ + fVar15;
      fVar18 = auVar97._20_4_;
      fVar90 = auVar130._20_4_ + fVar18;
      fVar21 = auVar97._24_4_;
      fVar91 = auVar130._24_4_ + fVar21;
      fVar10 = auVar34._0_4_;
      fVar149 = auVar31._0_4_ + fVar10;
      fVar116 = auVar34._4_4_;
      fVar158 = auVar31._4_4_ + fVar116;
      fVar122 = auVar34._8_4_;
      fVar160 = auVar31._8_4_ + fVar122;
      fVar13 = auVar34._12_4_;
      fVar161 = auVar31._12_4_ + fVar13;
      fVar16 = auVar34._16_4_;
      fVar162 = auVar31._16_4_ + fVar16;
      fVar19 = auVar34._20_4_;
      fVar163 = auVar31._20_4_ + fVar19;
      fVar22 = auVar34._24_4_;
      fVar164 = auVar31._24_4_ + fVar22;
      fVar150 = auVar34._28_4_;
      fVar98 = local_1000._0_4_;
      fVar99 = local_1000._4_4_;
      auVar32._4_4_ = fVar86 * fVar99;
      auVar32._0_4_ = fVar77 * fVar98;
      fVar24 = local_1000._8_4_;
      auVar32._8_4_ = fVar87 * fVar24;
      fVar25 = local_1000._12_4_;
      auVar32._12_4_ = fVar88 * fVar25;
      fVar26 = local_1000._16_4_;
      auVar32._16_4_ = fVar89 * fVar26;
      fVar27 = local_1000._20_4_;
      auVar32._20_4_ = fVar90 * fVar27;
      fVar28 = local_1000._24_4_;
      auVar32._24_4_ = fVar91 * fVar28;
      auVar32._28_4_ = uVar1;
      fVar210 = local_fe0._0_4_;
      fVar212 = local_fe0._4_4_;
      auVar33._4_4_ = fVar212 * fVar158;
      auVar33._0_4_ = fVar210 * fVar149;
      fVar214 = local_fe0._8_4_;
      auVar33._8_4_ = fVar214 * fVar160;
      fVar216 = local_fe0._12_4_;
      auVar33._12_4_ = fVar216 * fVar161;
      fVar218 = local_fe0._16_4_;
      auVar33._16_4_ = fVar218 * fVar162;
      fVar220 = local_fe0._20_4_;
      auVar33._20_4_ = fVar220 * fVar163;
      fVar222 = local_fe0._24_4_;
      auVar33._24_4_ = fVar222 * fVar164;
      auVar33._28_4_ = auVar30._28_4_;
      auVar32 = vsubps_avx(auVar33,auVar32);
      fVar11 = auVar84._0_4_;
      fVar165 = auVar81._0_4_ + fVar11;
      fVar118 = auVar84._4_4_;
      fVar169 = auVar81._4_4_ + fVar118;
      fVar124 = auVar84._8_4_;
      fVar170 = auVar81._8_4_ + fVar124;
      fVar14 = auVar84._12_4_;
      fVar171 = auVar81._12_4_ + fVar14;
      fVar17 = auVar84._16_4_;
      fVar172 = auVar81._16_4_ + fVar17;
      fVar20 = auVar84._20_4_;
      fVar173 = auVar81._20_4_ + fVar20;
      fVar23 = auVar84._24_4_;
      fVar174 = auVar81._24_4_ + fVar23;
      fVar175 = local_fc0._0_4_;
      fVar182 = local_fc0._4_4_;
      auVar35._4_4_ = fVar182 * fVar158;
      auVar35._0_4_ = fVar175 * fVar149;
      fVar185 = local_fc0._8_4_;
      auVar35._8_4_ = fVar185 * fVar160;
      fVar188 = local_fc0._12_4_;
      auVar35._12_4_ = fVar188 * fVar161;
      fVar191 = local_fc0._16_4_;
      auVar35._16_4_ = fVar191 * fVar162;
      fVar194 = local_fc0._20_4_;
      auVar35._20_4_ = fVar194 * fVar163;
      fVar197 = local_fc0._24_4_;
      auVar35._24_4_ = fVar197 * fVar164;
      auVar35._28_4_ = auVar31._28_4_ + fVar150;
      auVar36._4_4_ = fVar169 * fVar99;
      auVar36._0_4_ = fVar165 * fVar98;
      auVar36._8_4_ = fVar170 * fVar24;
      auVar36._12_4_ = fVar171 * fVar25;
      auVar36._16_4_ = fVar172 * fVar26;
      auVar36._20_4_ = fVar173 * fVar27;
      auVar36._24_4_ = fVar174 * fVar28;
      auVar36._28_4_ = auVar30._28_4_;
      auVar30 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = fVar169 * fVar212;
      auVar37._0_4_ = fVar165 * fVar210;
      auVar37._8_4_ = fVar170 * fVar214;
      auVar37._12_4_ = fVar171 * fVar216;
      auVar37._16_4_ = fVar172 * fVar218;
      auVar37._20_4_ = fVar173 * fVar220;
      auVar37._24_4_ = fVar174 * fVar222;
      auVar37._28_4_ = auVar81._28_4_ + auVar84._28_4_;
      auVar38._4_4_ = fVar182 * fVar86;
      auVar38._0_4_ = fVar175 * fVar77;
      auVar38._8_4_ = fVar185 * fVar87;
      auVar38._12_4_ = fVar188 * fVar88;
      auVar38._16_4_ = fVar191 * fVar89;
      auVar38._20_4_ = fVar194 * fVar90;
      auVar38._24_4_ = fVar197 * fVar91;
      auVar38._28_4_ = auVar130._28_4_ + auVar97._28_4_;
      fVar77 = *(float *)(ray + k * 4 + 0x60);
      auVar33 = vsubps_avx(auVar38,auVar37);
      fVar86 = *(float *)(ray + k * 4 + 0x50);
      fVar87 = *(float *)(ray + k * 4 + 0x40);
      local_1060._0_4_ = fVar87 * auVar32._0_4_ + fVar86 * auVar30._0_4_ + auVar33._0_4_ * fVar77;
      local_1060._4_4_ = fVar87 * auVar32._4_4_ + fVar86 * auVar30._4_4_ + auVar33._4_4_ * fVar77;
      local_1060._8_4_ = fVar87 * auVar32._8_4_ + fVar86 * auVar30._8_4_ + auVar33._8_4_ * fVar77;
      local_1060._12_4_ =
           fVar87 * auVar32._12_4_ + fVar86 * auVar30._12_4_ + auVar33._12_4_ * fVar77;
      local_1060._16_4_ =
           fVar87 * auVar32._16_4_ + fVar86 * auVar30._16_4_ + auVar33._16_4_ * fVar77;
      local_1060._20_4_ =
           fVar87 * auVar32._20_4_ + fVar86 * auVar30._20_4_ + auVar33._20_4_ * fVar77;
      local_1060._24_4_ =
           fVar87 * auVar32._24_4_ + fVar86 * auVar30._24_4_ + auVar33._24_4_ * fVar77;
      local_1060._28_4_ = auVar32._28_4_ + auVar30._28_4_ + auVar33._28_4_;
      local_1020 = vsubps_avx(auVar97,auVar144);
      local_1040 = vsubps_avx(auVar34,auVar29);
      fVar90 = fVar9 + auVar144._0_4_;
      fVar91 = fVar12 + auVar144._4_4_;
      fVar149 = fVar120 + auVar144._8_4_;
      fVar158 = fVar126 + auVar144._12_4_;
      fVar160 = fVar15 + auVar144._16_4_;
      fVar161 = fVar18 + auVar144._20_4_;
      fVar162 = fVar21 + auVar144._24_4_;
      fVar88 = auVar144._28_4_;
      fVar163 = fVar10 + auVar29._0_4_;
      fVar164 = fVar116 + auVar29._4_4_;
      fVar165 = fVar122 + auVar29._8_4_;
      fVar169 = fVar13 + auVar29._12_4_;
      fVar170 = fVar16 + auVar29._16_4_;
      fVar171 = fVar19 + auVar29._20_4_;
      fVar172 = fVar22 + auVar29._24_4_;
      fVar89 = auVar29._28_4_;
      fVar176 = local_1040._0_4_;
      fVar183 = local_1040._4_4_;
      auVar30._4_4_ = fVar183 * fVar91;
      auVar30._0_4_ = fVar176 * fVar90;
      fVar186 = local_1040._8_4_;
      auVar30._8_4_ = fVar186 * fVar149;
      fVar189 = local_1040._12_4_;
      auVar30._12_4_ = fVar189 * fVar158;
      fVar192 = local_1040._16_4_;
      auVar30._16_4_ = fVar192 * fVar160;
      fVar195 = local_1040._20_4_;
      auVar30._20_4_ = fVar195 * fVar161;
      fVar198 = local_1040._24_4_;
      auVar30._24_4_ = fVar198 * fVar162;
      auVar30._28_4_ = local_fe0._28_4_;
      fVar201 = local_1020._0_4_;
      fVar204 = local_1020._4_4_;
      auVar39._4_4_ = fVar204 * fVar164;
      auVar39._0_4_ = fVar201 * fVar163;
      fVar205 = local_1020._8_4_;
      auVar39._8_4_ = fVar205 * fVar165;
      fVar206 = local_1020._12_4_;
      auVar39._12_4_ = fVar206 * fVar169;
      fVar207 = local_1020._16_4_;
      auVar39._16_4_ = fVar207 * fVar170;
      fVar208 = local_1020._20_4_;
      auVar39._20_4_ = fVar208 * fVar171;
      fVar209 = local_1020._24_4_;
      auVar39._24_4_ = fVar209 * fVar172;
      auVar39._28_4_ = fVar150;
      auVar30 = vsubps_avx(auVar39,auVar30);
      auVar32 = vsubps_avx(auVar84,auVar146);
      fVar211 = auVar32._0_4_;
      fVar213 = auVar32._4_4_;
      auVar40._4_4_ = fVar213 * fVar164;
      auVar40._0_4_ = fVar211 * fVar163;
      fVar215 = auVar32._8_4_;
      auVar40._8_4_ = fVar215 * fVar165;
      fVar217 = auVar32._12_4_;
      auVar40._12_4_ = fVar217 * fVar169;
      fVar219 = auVar32._16_4_;
      auVar40._16_4_ = fVar219 * fVar170;
      fVar221 = auVar32._20_4_;
      auVar40._20_4_ = fVar221 * fVar171;
      fVar223 = auVar32._24_4_;
      auVar40._24_4_ = fVar223 * fVar172;
      auVar40._28_4_ = fVar150 + fVar89;
      fVar150 = fVar11 + auVar146._0_4_;
      fVar163 = fVar118 + auVar146._4_4_;
      fVar164 = fVar124 + auVar146._8_4_;
      fVar165 = fVar14 + auVar146._12_4_;
      fVar169 = fVar17 + auVar146._16_4_;
      fVar170 = fVar20 + auVar146._20_4_;
      fVar171 = fVar23 + auVar146._24_4_;
      auVar41._4_4_ = fVar163 * fVar183;
      auVar41._0_4_ = fVar150 * fVar176;
      auVar41._8_4_ = fVar164 * fVar186;
      auVar41._12_4_ = fVar165 * fVar189;
      auVar41._16_4_ = fVar169 * fVar192;
      auVar41._20_4_ = fVar170 * fVar195;
      auVar41._24_4_ = fVar171 * fVar198;
      auVar41._28_4_ = local_1040._28_4_;
      auVar32 = vsubps_avx(auVar41,auVar40);
      auVar42._4_4_ = fVar163 * fVar204;
      auVar42._0_4_ = fVar150 * fVar201;
      auVar42._8_4_ = fVar164 * fVar205;
      auVar42._12_4_ = fVar165 * fVar206;
      auVar42._16_4_ = fVar169 * fVar207;
      auVar42._20_4_ = fVar170 * fVar208;
      auVar42._24_4_ = fVar171 * fVar209;
      auVar42._28_4_ = auVar84._28_4_ + auVar146._28_4_;
      auVar43._4_4_ = fVar213 * fVar91;
      auVar43._0_4_ = fVar211 * fVar90;
      auVar43._8_4_ = fVar215 * fVar149;
      auVar43._12_4_ = fVar217 * fVar158;
      auVar43._16_4_ = fVar219 * fVar160;
      auVar43._20_4_ = fVar221 * fVar161;
      auVar43._24_4_ = fVar223 * fVar162;
      auVar43._28_4_ = auVar97._28_4_ + fVar88;
      auVar33 = vsubps_avx(auVar43,auVar42);
      fVar151 = fVar87 * auVar30._0_4_ + auVar33._0_4_ * fVar77 + fVar86 * auVar32._0_4_;
      fVar159 = fVar87 * auVar30._4_4_ + auVar33._4_4_ * fVar77 + fVar86 * auVar32._4_4_;
      auVar152._0_8_ = CONCAT44(fVar159,fVar151);
      auVar152._8_4_ = fVar87 * auVar30._8_4_ + auVar33._8_4_ * fVar77 + fVar86 * auVar32._8_4_;
      auVar152._12_4_ = fVar87 * auVar30._12_4_ + auVar33._12_4_ * fVar77 + fVar86 * auVar32._12_4_;
      auVar153._16_4_ = fVar87 * auVar30._16_4_ + auVar33._16_4_ * fVar77 + fVar86 * auVar32._16_4_;
      auVar153._0_16_ = auVar152;
      auVar153._20_4_ = fVar87 * auVar30._20_4_ + auVar33._20_4_ * fVar77 + fVar86 * auVar32._20_4_;
      auVar154._24_4_ = fVar87 * auVar30._24_4_ + auVar33._24_4_ * fVar77 + fVar86 * auVar32._24_4_;
      auVar154._0_24_ = auVar153;
      auVar154._28_4_ = auVar32._28_4_ + auVar33._28_4_ + auVar32._28_4_;
      auVar30 = vsubps_avx(auVar146,auVar81);
      fVar171 = auVar81._0_4_ + auVar146._0_4_;
      fVar172 = auVar81._4_4_ + auVar146._4_4_;
      fVar173 = auVar81._8_4_ + auVar146._8_4_;
      fVar174 = auVar81._12_4_ + auVar146._12_4_;
      fVar104 = auVar81._16_4_ + auVar146._16_4_;
      fVar105 = auVar81._20_4_ + auVar146._20_4_;
      fVar106 = auVar81._24_4_ + auVar146._24_4_;
      auVar32 = vsubps_avx(auVar144,auVar130);
      fVar107 = auVar144._0_4_ + auVar130._0_4_;
      fVar115 = auVar144._4_4_ + auVar130._4_4_;
      fVar117 = auVar144._8_4_ + auVar130._8_4_;
      fVar119 = auVar144._12_4_ + auVar130._12_4_;
      fVar121 = auVar144._16_4_ + auVar130._16_4_;
      fVar123 = auVar144._20_4_ + auVar130._20_4_;
      fVar125 = auVar144._24_4_ + auVar130._24_4_;
      fVar127 = fVar88 + auVar130._28_4_;
      auVar144 = vsubps_avx(auVar29,auVar31);
      fVar163 = auVar29._0_4_ + auVar31._0_4_;
      fVar164 = auVar29._4_4_ + auVar31._4_4_;
      fVar165 = auVar29._8_4_ + auVar31._8_4_;
      fVar169 = auVar29._12_4_ + auVar31._12_4_;
      fVar170 = auVar29._16_4_ + auVar31._16_4_;
      fVar134 = auVar29._20_4_ + auVar31._20_4_;
      fVar135 = auVar29._24_4_ + auVar31._24_4_;
      fVar150 = auVar144._0_4_;
      fVar90 = auVar144._4_4_;
      auVar29._4_4_ = fVar115 * fVar90;
      auVar29._0_4_ = fVar107 * fVar150;
      fVar91 = auVar144._8_4_;
      auVar29._8_4_ = fVar117 * fVar91;
      fVar149 = auVar144._12_4_;
      auVar29._12_4_ = fVar119 * fVar149;
      fVar158 = auVar144._16_4_;
      auVar29._16_4_ = fVar121 * fVar158;
      fVar160 = auVar144._20_4_;
      auVar29._20_4_ = fVar123 * fVar160;
      fVar161 = auVar144._24_4_;
      auVar29._24_4_ = fVar125 * fVar161;
      auVar29._28_4_ = fVar88;
      fVar177 = auVar32._0_4_;
      fVar184 = auVar32._4_4_;
      auVar44._4_4_ = fVar184 * fVar164;
      auVar44._0_4_ = fVar177 * fVar163;
      fVar187 = auVar32._8_4_;
      auVar44._8_4_ = fVar187 * fVar165;
      fVar190 = auVar32._12_4_;
      auVar44._12_4_ = fVar190 * fVar169;
      fVar193 = auVar32._16_4_;
      auVar44._16_4_ = fVar193 * fVar170;
      fVar196 = auVar32._20_4_;
      auVar44._20_4_ = fVar196 * fVar134;
      fVar199 = auVar32._24_4_;
      auVar44._24_4_ = fVar199 * fVar135;
      auVar44._28_4_ = fVar89;
      auVar130 = vsubps_avx(auVar44,auVar29);
      fVar88 = auVar30._0_4_;
      fVar162 = auVar30._4_4_;
      auVar45._4_4_ = fVar162 * fVar164;
      auVar45._0_4_ = fVar88 * fVar163;
      fVar163 = auVar30._8_4_;
      auVar45._8_4_ = fVar163 * fVar165;
      fVar164 = auVar30._12_4_;
      auVar45._12_4_ = fVar164 * fVar169;
      fVar165 = auVar30._16_4_;
      auVar45._16_4_ = fVar165 * fVar170;
      fVar169 = auVar30._20_4_;
      auVar45._20_4_ = fVar169 * fVar134;
      fVar170 = auVar30._24_4_;
      auVar45._24_4_ = fVar170 * fVar135;
      auVar45._28_4_ = fVar89 + auVar31._28_4_;
      auVar31._4_4_ = fVar172 * fVar90;
      auVar31._0_4_ = fVar171 * fVar150;
      auVar31._8_4_ = fVar173 * fVar91;
      auVar31._12_4_ = fVar174 * fVar149;
      auVar31._16_4_ = fVar104 * fVar158;
      auVar31._20_4_ = fVar105 * fVar160;
      auVar31._24_4_ = fVar106 * fVar161;
      auVar31._28_4_ = fVar89;
      auVar29 = vsubps_avx(auVar31,auVar45);
      auVar46._4_4_ = fVar184 * fVar172;
      auVar46._0_4_ = fVar177 * fVar171;
      auVar46._8_4_ = fVar187 * fVar173;
      auVar46._12_4_ = fVar190 * fVar174;
      auVar46._16_4_ = fVar193 * fVar104;
      auVar46._20_4_ = fVar196 * fVar105;
      auVar46._24_4_ = fVar199 * fVar106;
      auVar46._28_4_ = auVar81._28_4_ + auVar146._28_4_;
      auVar47._4_4_ = fVar162 * fVar115;
      auVar47._0_4_ = fVar88 * fVar107;
      auVar47._8_4_ = fVar163 * fVar117;
      auVar47._12_4_ = fVar164 * fVar119;
      auVar47._16_4_ = fVar165 * fVar121;
      auVar47._20_4_ = fVar169 * fVar123;
      auVar47._24_4_ = fVar170 * fVar125;
      auVar47._28_4_ = fVar127;
      auVar146 = vsubps_avx(auVar47,auVar46);
      auVar103._0_4_ = fVar87 * auVar130._0_4_ + auVar146._0_4_ * fVar77 + fVar86 * auVar29._0_4_;
      auVar103._4_4_ = fVar87 * auVar130._4_4_ + auVar146._4_4_ * fVar77 + fVar86 * auVar29._4_4_;
      auVar103._8_4_ = fVar87 * auVar130._8_4_ + auVar146._8_4_ * fVar77 + fVar86 * auVar29._8_4_;
      auVar103._12_4_ =
           fVar87 * auVar130._12_4_ + auVar146._12_4_ * fVar77 + fVar86 * auVar29._12_4_;
      auVar103._16_4_ =
           fVar87 * auVar130._16_4_ + auVar146._16_4_ * fVar77 + fVar86 * auVar29._16_4_;
      auVar103._20_4_ =
           fVar87 * auVar130._20_4_ + auVar146._20_4_ * fVar77 + fVar86 * auVar29._20_4_;
      auVar103._24_4_ =
           fVar87 * auVar130._24_4_ + auVar146._24_4_ * fVar77 + fVar86 * auVar29._24_4_;
      auVar103._28_4_ = fVar127 + auVar146._28_4_ + fVar127;
      local_1080._0_4_ = auVar103._0_4_ + local_1060._0_4_ + fVar151;
      local_1080._4_4_ = auVar103._4_4_ + local_1060._4_4_ + fVar159;
      local_1080._8_4_ = auVar103._8_4_ + local_1060._8_4_ + auVar152._8_4_;
      local_1080._12_4_ = auVar103._12_4_ + local_1060._12_4_ + auVar152._12_4_;
      local_1080._16_4_ = auVar103._16_4_ + local_1060._16_4_ + auVar153._16_4_;
      local_1080._20_4_ = auVar103._20_4_ + local_1060._20_4_ + auVar153._20_4_;
      local_1080._24_4_ = auVar103._24_4_ + local_1060._24_4_ + auVar154._24_4_;
      local_1080._28_4_ = auVar103._28_4_ + local_1060._28_4_ + auVar154._28_4_;
      auVar146 = vminps_avx(local_1060,auVar154);
      auVar146 = vminps_avx(auVar146,auVar103);
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147._16_4_ = 0x7fffffff;
      auVar147._20_4_ = 0x7fffffff;
      auVar147._24_4_ = 0x7fffffff;
      auVar147._28_4_ = 0x7fffffff;
      local_10a0 = vandps_avx(auVar147,local_1080);
      fVar89 = local_10a0._0_4_ * 1.1920929e-07;
      fVar171 = local_10a0._4_4_ * 1.1920929e-07;
      auVar48._4_4_ = fVar171;
      auVar48._0_4_ = fVar89;
      fVar172 = local_10a0._8_4_ * 1.1920929e-07;
      auVar48._8_4_ = fVar172;
      fVar173 = local_10a0._12_4_ * 1.1920929e-07;
      auVar48._12_4_ = fVar173;
      fVar174 = local_10a0._16_4_ * 1.1920929e-07;
      auVar48._16_4_ = fVar174;
      fVar104 = local_10a0._20_4_ * 1.1920929e-07;
      auVar48._20_4_ = fVar104;
      fVar105 = local_10a0._24_4_ * 1.1920929e-07;
      auVar48._24_4_ = fVar105;
      auVar48._28_4_ = 0x34000000;
      auVar139._0_8_ = CONCAT44(fVar171,fVar89) ^ 0x8000000080000000;
      auVar139._8_4_ = -fVar172;
      auVar139._12_4_ = -fVar173;
      auVar139._16_4_ = -fVar174;
      auVar139._20_4_ = -fVar104;
      auVar139._24_4_ = -fVar105;
      auVar139._28_4_ = 0xb4000000;
      auVar146 = vcmpps_avx(auVar146,auVar139,5);
      auVar81 = vmaxps_avx(local_1060,auVar154);
      auVar81 = vmaxps_avx(auVar81,auVar103);
      auVar81 = vcmpps_avx(auVar81,auVar48,2);
      auVar81 = vorps_avx(auVar146,auVar81);
      auVar143 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
      if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar81 >> 0x7f,0) != '\0') ||
            (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0xbf,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar81[0x1f] < '\0') {
        auVar49._4_4_ = fVar204 * fVar99;
        auVar49._0_4_ = fVar201 * fVar98;
        auVar49._8_4_ = fVar205 * fVar24;
        auVar49._12_4_ = fVar206 * fVar25;
        auVar49._16_4_ = fVar207 * fVar26;
        auVar49._20_4_ = fVar208 * fVar27;
        auVar49._24_4_ = fVar209 * fVar28;
        auVar49._28_4_ = auVar146._28_4_;
        auVar50._4_4_ = fVar212 * fVar183;
        auVar50._0_4_ = fVar210 * fVar176;
        auVar50._8_4_ = fVar214 * fVar186;
        auVar50._12_4_ = fVar216 * fVar189;
        auVar50._16_4_ = fVar218 * fVar192;
        auVar50._20_4_ = fVar220 * fVar195;
        auVar50._24_4_ = fVar222 * fVar198;
        auVar50._28_4_ = 0x34000000;
        auVar29 = vsubps_avx(auVar50,auVar49);
        auVar143 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
        auVar140._0_4_ = fVar177 * fVar176;
        auVar140._4_4_ = fVar184 * fVar183;
        auVar140._8_4_ = fVar187 * fVar186;
        auVar140._12_4_ = fVar190 * fVar189;
        auVar140._16_4_ = fVar193 * fVar192;
        auVar140._20_4_ = fVar196 * fVar195;
        auVar140._24_4_ = fVar199 * fVar198;
        auVar140._28_4_ = 0;
        auVar51._4_4_ = fVar204 * fVar90;
        auVar51._0_4_ = fVar201 * fVar150;
        auVar51._8_4_ = fVar205 * fVar91;
        auVar51._12_4_ = fVar206 * fVar149;
        auVar51._16_4_ = fVar207 * fVar158;
        auVar51._20_4_ = fVar208 * fVar160;
        auVar51._24_4_ = fVar209 * fVar161;
        auVar51._28_4_ = local_10a0._28_4_;
        auVar31 = vsubps_avx(auVar51,auVar140);
        auVar146 = vandps_avx(auVar147,auVar49);
        auVar130 = vandps_avx(auVar147,auVar140);
        auVar146 = vcmpps_avx(auVar146,auVar130,1);
        local_11a0 = vblendvps_avx(auVar31,auVar29,auVar146);
        auVar52._4_4_ = fVar213 * fVar90;
        auVar52._0_4_ = fVar211 * fVar150;
        auVar52._8_4_ = fVar215 * fVar91;
        auVar52._12_4_ = fVar217 * fVar149;
        auVar52._16_4_ = fVar219 * fVar158;
        auVar52._20_4_ = fVar221 * fVar160;
        auVar52._24_4_ = fVar223 * fVar161;
        auVar52._28_4_ = auVar144._28_4_;
        auVar53._4_4_ = fVar213 * fVar99;
        auVar53._0_4_ = fVar211 * fVar98;
        auVar53._8_4_ = fVar215 * fVar24;
        auVar53._12_4_ = fVar217 * fVar25;
        auVar53._16_4_ = fVar219 * fVar26;
        auVar53._20_4_ = fVar221 * fVar27;
        auVar53._24_4_ = fVar223 * fVar28;
        auVar53._28_4_ = auVar146._28_4_;
        auVar54._4_4_ = fVar182 * fVar183;
        auVar54._0_4_ = fVar175 * fVar176;
        auVar54._8_4_ = fVar185 * fVar186;
        auVar54._12_4_ = fVar188 * fVar189;
        auVar54._16_4_ = fVar191 * fVar192;
        auVar54._20_4_ = fVar194 * fVar195;
        auVar54._24_4_ = fVar197 * fVar198;
        auVar54._28_4_ = auVar29._28_4_;
        auVar130 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = fVar183 * fVar162;
        auVar55._0_4_ = fVar176 * fVar88;
        auVar55._8_4_ = fVar186 * fVar163;
        auVar55._12_4_ = fVar189 * fVar164;
        auVar55._16_4_ = fVar192 * fVar165;
        auVar55._20_4_ = fVar195 * fVar169;
        auVar55._24_4_ = fVar198 * fVar170;
        auVar55._28_4_ = auVar31._28_4_;
        auVar29 = vsubps_avx(auVar55,auVar52);
        auVar146 = vandps_avx(auVar147,auVar54);
        auVar144 = vandps_avx(auVar147,auVar52);
        auVar144 = vcmpps_avx(auVar146,auVar144,1);
        local_1180 = vblendvps_avx(auVar29,auVar130,auVar144);
        auVar56._4_4_ = fVar204 * fVar162;
        auVar56._0_4_ = fVar201 * fVar88;
        auVar56._8_4_ = fVar205 * fVar163;
        auVar56._12_4_ = fVar206 * fVar164;
        auVar56._16_4_ = fVar207 * fVar165;
        auVar56._20_4_ = fVar208 * fVar169;
        auVar56._24_4_ = fVar209 * fVar170;
        auVar56._28_4_ = auVar30._28_4_;
        auVar57._4_4_ = fVar182 * fVar204;
        auVar57._0_4_ = fVar175 * fVar201;
        auVar57._8_4_ = fVar185 * fVar205;
        auVar57._12_4_ = fVar188 * fVar206;
        auVar57._16_4_ = fVar191 * fVar207;
        auVar57._20_4_ = fVar194 * fVar208;
        auVar57._24_4_ = fVar197 * fVar209;
        auVar57._28_4_ = auVar144._28_4_;
        auVar58._4_4_ = fVar213 * fVar212;
        auVar58._0_4_ = fVar211 * fVar210;
        auVar58._8_4_ = fVar215 * fVar214;
        auVar58._12_4_ = fVar217 * fVar216;
        auVar58._16_4_ = fVar219 * fVar218;
        auVar58._20_4_ = fVar221 * fVar220;
        auVar58._24_4_ = fVar223 * fVar222;
        auVar58._28_4_ = auVar130._28_4_;
        auVar59._4_4_ = fVar213 * fVar184;
        auVar59._0_4_ = fVar211 * fVar177;
        auVar59._8_4_ = fVar215 * fVar187;
        auVar59._12_4_ = fVar217 * fVar190;
        auVar59._16_4_ = fVar219 * fVar193;
        auVar59._20_4_ = fVar221 * fVar196;
        auVar59._24_4_ = fVar223 * fVar199;
        auVar59._28_4_ = auVar146._28_4_;
        auVar130 = vsubps_avx(auVar57,auVar58);
        auVar29 = vsubps_avx(auVar59,auVar56);
        auVar146 = vandps_avx(auVar147,auVar58);
        auVar144 = vandps_avx(auVar147,auVar56);
        auVar144 = vcmpps_avx(auVar146,auVar144,1);
        local_1160 = vblendvps_avx(auVar29,auVar130,auVar144);
        auVar92 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
        fVar150 = local_11a0._0_4_ * fVar87 + local_1160._0_4_ * fVar77 + local_1180._0_4_ * fVar86;
        fVar88 = local_11a0._4_4_ * fVar87 + local_1160._4_4_ * fVar77 + local_1180._4_4_ * fVar86;
        fVar89 = local_11a0._8_4_ * fVar87 + local_1160._8_4_ * fVar77 + local_1180._8_4_ * fVar86;
        fVar98 = local_11a0._12_4_ * fVar87 +
                 local_1160._12_4_ * fVar77 + local_1180._12_4_ * fVar86;
        fVar99 = local_11a0._16_4_ * fVar87 +
                 local_1160._16_4_ * fVar77 + local_1180._16_4_ * fVar86;
        fVar90 = local_11a0._20_4_ * fVar87 +
                 local_1160._20_4_ * fVar77 + local_1180._20_4_ * fVar86;
        fVar77 = local_11a0._24_4_ * fVar87 +
                 local_1160._24_4_ * fVar77 + local_1180._24_4_ * fVar86;
        fVar86 = auVar146._28_4_ + auVar146._28_4_ + 0.0;
        auVar94._0_4_ = fVar150 + fVar150;
        auVar94._4_4_ = fVar88 + fVar88;
        auVar94._8_4_ = fVar89 + fVar89;
        auVar94._12_4_ = fVar98 + fVar98;
        auVar94._16_4_ = fVar99 + fVar99;
        auVar94._20_4_ = fVar90 + fVar90;
        auVar94._24_4_ = fVar77 + fVar77;
        auVar94._28_4_ = fVar86 + fVar86;
        fVar150 = local_11a0._0_4_ * fVar11 + local_1160._0_4_ * fVar10 + local_1180._0_4_ * fVar9;
        fVar116 = local_11a0._4_4_ * fVar118 +
                  local_1160._4_4_ * fVar116 + local_1180._4_4_ * fVar12;
        fVar118 = local_11a0._8_4_ * fVar124 +
                  local_1160._8_4_ * fVar122 + local_1180._8_4_ * fVar120;
        fVar120 = local_11a0._12_4_ * fVar14 +
                  local_1160._12_4_ * fVar13 + local_1180._12_4_ * fVar126;
        fVar122 = local_11a0._16_4_ * fVar17 +
                  local_1160._16_4_ * fVar16 + local_1180._16_4_ * fVar15;
        fVar124 = local_11a0._20_4_ * fVar20 +
                  local_1160._20_4_ * fVar19 + local_1180._20_4_ * fVar18;
        fVar126 = local_11a0._24_4_ * fVar23 +
                  local_1160._24_4_ * fVar22 + local_1180._24_4_ * fVar21;
        auVar146 = vrcpps_avx(auVar94);
        fVar77 = auVar146._0_4_;
        fVar86 = auVar146._4_4_;
        auVar60._4_4_ = auVar94._4_4_ * fVar86;
        auVar60._0_4_ = auVar94._0_4_ * fVar77;
        fVar87 = auVar146._8_4_;
        auVar60._8_4_ = auVar94._8_4_ * fVar87;
        fVar9 = auVar146._12_4_;
        auVar60._12_4_ = auVar94._12_4_ * fVar9;
        fVar10 = auVar146._16_4_;
        auVar60._16_4_ = auVar94._16_4_ * fVar10;
        fVar11 = auVar146._20_4_;
        auVar60._20_4_ = auVar94._20_4_ * fVar11;
        fVar12 = auVar146._24_4_;
        auVar60._24_4_ = auVar94._24_4_ * fVar12;
        auVar60._28_4_ = local_1180._28_4_;
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar145._16_4_ = 0x3f800000;
        auVar145._20_4_ = 0x3f800000;
        auVar145._24_4_ = 0x3f800000;
        auVar145._28_4_ = 0x3f800000;
        auVar146 = vsubps_avx(auVar145,auVar60);
        local_13c0._4_4_ = (fVar116 + fVar116) * (fVar86 + fVar86 * auVar146._4_4_);
        local_13c0._0_4_ = (fVar150 + fVar150) * (fVar77 + fVar77 * auVar146._0_4_);
        local_13c0._8_4_ = (fVar118 + fVar118) * (fVar87 + fVar87 * auVar146._8_4_);
        local_13c0._12_4_ = (fVar120 + fVar120) * (fVar9 + fVar9 * auVar146._12_4_);
        local_13c0._16_4_ = (fVar122 + fVar122) * (fVar10 + fVar10 * auVar146._16_4_);
        local_13c0._20_4_ = (fVar124 + fVar124) * (fVar11 + fVar11 * auVar146._20_4_);
        local_13c0._24_4_ = (fVar126 + fVar126) * (fVar12 + fVar12 * auVar146._24_4_);
        local_13c0._28_4_ = auVar146._28_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar112._4_4_ = uVar1;
        auVar112._0_4_ = uVar1;
        auVar112._8_4_ = uVar1;
        auVar112._12_4_ = uVar1;
        auVar112._16_4_ = uVar1;
        auVar112._20_4_ = uVar1;
        auVar112._24_4_ = uVar1;
        auVar112._28_4_ = uVar1;
        auVar146 = vcmpps_avx(auVar112,local_13c0,2);
        auVar100 = vshufps_avx(auVar143,auVar143,0);
        auVar132._16_16_ = auVar100;
        auVar132._0_16_ = auVar100;
        auVar81 = vcmpps_avx(local_13c0,auVar132,2);
        auVar146 = vandps_avx(auVar81,auVar146);
        auVar100 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
        auVar92 = vpand_avx(auVar100,auVar92);
        auVar100 = vpmovsxwd_avx(auVar92);
        auVar101 = vpshufd_avx(auVar92,0xee);
        auVar101 = vpmovsxwd_avx(auVar101);
        auVar113._16_16_ = auVar101;
        auVar113._0_16_ = auVar100;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar101 >> 0x3f,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0xf] < '\0') {
          auVar146 = vcmpps_avx(auVar94,_DAT_01f7b000,4);
          auVar100 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
          auVar92 = vpand_avx(auVar92,auVar100);
          auVar100 = vpmovsxwd_avx(auVar92);
          auVar92 = vpunpckhwd_avx(auVar92,auVar92);
          local_1220._16_16_ = auVar92;
          local_1220._0_16_ = auVar100;
          if ((((((((local_1220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1220 >> 0x7f,0) != '\0') ||
                (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar92 >> 0x3f,0) != '\0') ||
              (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar92[0xf] < '\0') {
            uVar65 = pGVar69->_geomID;
            uVar66 = pGVar69->_primID;
            local_12a0 = local_1060;
            local_13a0._8_8_ = auVar152._8_8_;
            local_13a0._16_8_ = auVar153._16_8_;
            local_13a0._24_8_ = auVar154._24_8_;
            local_1280 = auVar152._0_8_;
            uStack_1278 = local_13a0._8_8_;
            uStack_1270 = local_13a0._16_8_;
            uStack_1268 = local_13a0._24_8_;
            local_1260 = local_1080;
            local_1240 = &local_13f8;
            local_11c0 = local_13c0;
            pGVar74 = (context->scene->geometries).items[uVar65].ptr;
            if ((pGVar74->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar143 = *(undefined1 (*) [16])(local_13f8 + local_13f0 * 4);
              auVar101 = auVar143;
              if (2 < local_13e8) {
                auVar101 = *(undefined1 (*) [16])(local_13f8 + local_13f0 * 8);
              }
              auVar146 = vrcpps_avx(local_1080);
              fVar77 = auVar146._0_4_;
              fVar86 = auVar146._4_4_;
              auVar61._4_4_ = local_1080._4_4_ * fVar86;
              auVar61._0_4_ = local_1080._0_4_ * fVar77;
              fVar87 = auVar146._8_4_;
              auVar61._8_4_ = local_1080._8_4_ * fVar87;
              fVar9 = auVar146._12_4_;
              auVar61._12_4_ = local_1080._12_4_ * fVar9;
              fVar10 = auVar146._16_4_;
              auVar61._16_4_ = local_1080._16_4_ * fVar10;
              fVar11 = auVar146._20_4_;
              auVar61._20_4_ = local_1080._20_4_ * fVar11;
              fVar12 = auVar146._24_4_;
              auVar61._24_4_ = local_1080._24_4_ * fVar12;
              auVar61._28_4_ = local_1080._28_4_;
              auVar141._8_4_ = 0x3f800000;
              auVar141._0_8_ = 0x3f8000003f800000;
              auVar141._12_4_ = 0x3f800000;
              auVar141._16_4_ = 0x3f800000;
              auVar141._20_4_ = 0x3f800000;
              auVar141._24_4_ = 0x3f800000;
              auVar141._28_4_ = 0x3f800000;
              auVar81 = vsubps_avx(auVar141,auVar61);
              auVar82._0_4_ = fVar77 + fVar77 * auVar81._0_4_;
              auVar82._4_4_ = fVar86 + fVar86 * auVar81._4_4_;
              auVar82._8_4_ = fVar87 + fVar87 * auVar81._8_4_;
              auVar82._12_4_ = fVar9 + fVar9 * auVar81._12_4_;
              auVar82._16_4_ = fVar10 + fVar10 * auVar81._16_4_;
              auVar82._20_4_ = fVar11 + fVar11 * auVar81._20_4_;
              auVar82._24_4_ = fVar12 + fVar12 * auVar81._24_4_;
              auVar82._28_4_ = auVar146._28_4_ + auVar81._28_4_;
              auVar95._8_4_ = 0x219392ef;
              auVar95._0_8_ = 0x219392ef219392ef;
              auVar95._12_4_ = 0x219392ef;
              auVar95._16_4_ = 0x219392ef;
              auVar95._20_4_ = 0x219392ef;
              auVar95._24_4_ = 0x219392ef;
              auVar95._28_4_ = 0x219392ef;
              auVar146 = vcmpps_avx(local_10a0,auVar95,5);
              auVar146 = vandps_avx(auVar146,auVar82);
              auVar62._4_4_ = local_1060._4_4_ * auVar146._4_4_;
              auVar62._0_4_ = local_1060._0_4_ * auVar146._0_4_;
              auVar62._8_4_ = local_1060._8_4_ * auVar146._8_4_;
              auVar62._12_4_ = local_1060._12_4_ * auVar146._12_4_;
              auVar62._16_4_ = local_1060._16_4_ * auVar146._16_4_;
              auVar62._20_4_ = local_1060._20_4_ * auVar146._20_4_;
              auVar62._24_4_ = local_1060._24_4_ * auVar146._24_4_;
              auVar62._28_4_ = auVar82._28_4_;
              auVar81 = vminps_avx(auVar62,auVar141);
              auVar63._4_4_ = auVar146._4_4_ * fVar159;
              auVar63._0_4_ = auVar146._0_4_ * fVar151;
              auVar63._8_4_ = auVar146._8_4_ * auVar152._8_4_;
              auVar63._12_4_ = auVar146._12_4_ * auVar152._12_4_;
              auVar63._16_4_ = auVar146._16_4_ * auVar153._16_4_;
              auVar63._20_4_ = auVar146._20_4_ * auVar153._20_4_;
              auVar63._24_4_ = auVar146._24_4_ * auVar154._24_4_;
              auVar63._28_4_ = auVar146._28_4_;
              auVar146 = vminps_avx(auVar63,auVar141);
              auVar166 = *(undefined1 (*) [16])local_13f8;
              if (local_13f0 == 2) {
                auVar166 = vpshufd_avx(auVar166,0x54);
                auVar143 = vpshufd_avx(auVar143,0x54);
                auVar101 = vpshufd_avx(auVar101,0x54);
              }
              auVar142._16_16_ = auVar143;
              auVar142._0_16_ = auVar166;
              auVar155._16_16_ = auVar101;
              auVar155._0_16_ = auVar143;
              auVar32 = vunpcklps_avx(auVar142,auVar155);
              auVar166 = vpshufd_avx(auVar166,0xa5);
              auVar109 = vpshufd_avx(auVar143,0xa5);
              auVar148._0_16_ = vpsrld_avx(auVar32._0_16_,0x10);
              auVar179 = vpsrld_avx(auVar32._16_16_,0x10);
              auVar148._16_16_ = auVar179;
              auVar181._16_16_ = auVar109;
              auVar181._0_16_ = auVar166;
              auVar143 = vpshufd_avx(auVar143,0x94);
              auVar101 = vpshufd_avx(auVar101,0x94);
              auVar156._0_16_ = vpsrld_avx(auVar166,0x10);
              auVar166 = vpsrld_avx(auVar109,0x10);
              auVar156._16_16_ = auVar166;
              auVar168._16_16_ = auVar101;
              auVar168._0_16_ = auVar143;
              auVar138._0_16_ = vpsrld_avx(auVar143,0x10);
              auVar143 = vpsrld_avx(auVar101,0x10);
              auVar138._16_16_ = auVar143;
              auVar114._8_4_ = 0xffff;
              auVar114._0_8_ = 0xffff0000ffff;
              auVar114._12_4_ = 0xffff;
              auVar114._16_4_ = 0xffff;
              auVar114._20_4_ = 0xffff;
              auVar114._24_4_ = 0xffff;
              auVar114._28_4_ = 0xffff;
              auVar144 = vandps_avx(auVar181,auVar114);
              auVar130 = vcvtdq2ps_avx(auVar144);
              auVar144 = vandps_avx(auVar168,auVar114);
              auVar29 = vcvtdq2ps_avx(auVar144);
              auVar30 = vcvtdq2ps_avx(auVar156);
              auVar31 = vcvtdq2ps_avx(auVar138);
              auVar157._8_4_ = 0x3f800000;
              auVar157._0_8_ = 0x3f8000003f800000;
              auVar157._12_4_ = 0x3f800000;
              auVar157._16_4_ = 0x3f800000;
              auVar157._20_4_ = 0x3f800000;
              auVar157._24_4_ = 0x3f800000;
              auVar157._28_4_ = 0x3f800000;
              auVar144 = vsubps_avx(auVar157,auVar81);
              auVar33 = vsubps_avx(auVar144,auVar146);
              auVar144 = vandps_avx(auVar32,auVar114);
              auVar144 = vcvtdq2ps_avx(auVar144);
              auVar32 = vcvtdq2ps_avx(auVar148);
              local_1200[0] =
                   auVar29._0_4_ * 0.00012207031 * auVar146._0_4_ +
                   auVar81._0_4_ * auVar130._0_4_ * 0.00012207031 +
                   auVar33._0_4_ * auVar144._0_4_ * 0.00012207031;
              local_1200[1] =
                   auVar29._4_4_ * 0.00012207031 * auVar146._4_4_ +
                   auVar81._4_4_ * auVar130._4_4_ * 0.00012207031 +
                   auVar33._4_4_ * auVar144._4_4_ * 0.00012207031;
              local_1200[2] =
                   auVar29._8_4_ * 0.00012207031 * auVar146._8_4_ +
                   auVar81._8_4_ * auVar130._8_4_ * 0.00012207031 +
                   auVar33._8_4_ * auVar144._8_4_ * 0.00012207031;
              local_1200[3] =
                   auVar29._12_4_ * 0.00012207031 * auVar146._12_4_ +
                   auVar81._12_4_ * auVar130._12_4_ * 0.00012207031 +
                   auVar33._12_4_ * auVar144._12_4_ * 0.00012207031;
              fStack_11f0 = auVar29._16_4_ * 0.00012207031 * auVar146._16_4_ +
                            auVar81._16_4_ * auVar130._16_4_ * 0.00012207031 +
                            auVar33._16_4_ * auVar144._16_4_ * 0.00012207031;
              fStack_11ec = auVar29._20_4_ * 0.00012207031 * auVar146._20_4_ +
                            auVar81._20_4_ * auVar130._20_4_ * 0.00012207031 +
                            auVar33._20_4_ * auVar144._20_4_ * 0.00012207031;
              fStack_11e8 = auVar29._24_4_ * 0.00012207031 * auVar146._24_4_ +
                            auVar81._24_4_ * auVar130._24_4_ * 0.00012207031 +
                            auVar33._24_4_ * auVar144._24_4_ * 0.00012207031;
              fStack_11e4 = auVar29._28_4_ + auVar130._28_4_ + auVar144._28_4_;
              local_11e0[0] =
                   auVar30._0_4_ * 0.00012207031 * auVar81._0_4_ +
                   auVar146._0_4_ * auVar31._0_4_ * 0.00012207031 +
                   auVar33._0_4_ * auVar32._0_4_ * 0.00012207031;
              local_11e0[1] =
                   auVar30._4_4_ * 0.00012207031 * auVar81._4_4_ +
                   auVar146._4_4_ * auVar31._4_4_ * 0.00012207031 +
                   auVar33._4_4_ * auVar32._4_4_ * 0.00012207031;
              local_11e0[2] =
                   auVar30._8_4_ * 0.00012207031 * auVar81._8_4_ +
                   auVar146._8_4_ * auVar31._8_4_ * 0.00012207031 +
                   auVar33._8_4_ * auVar32._8_4_ * 0.00012207031;
              local_11e0[3] =
                   auVar30._12_4_ * 0.00012207031 * auVar81._12_4_ +
                   auVar146._12_4_ * auVar31._12_4_ * 0.00012207031 +
                   auVar33._12_4_ * auVar32._12_4_ * 0.00012207031;
              fStack_11d0 = auVar30._16_4_ * 0.00012207031 * auVar81._16_4_ +
                            auVar146._16_4_ * auVar31._16_4_ * 0.00012207031 +
                            auVar33._16_4_ * auVar32._16_4_ * 0.00012207031;
              fStack_11cc = auVar30._20_4_ * 0.00012207031 * auVar81._20_4_ +
                            auVar146._20_4_ * auVar31._20_4_ * 0.00012207031 +
                            auVar33._20_4_ * auVar32._20_4_ * 0.00012207031;
              fStack_11c8 = auVar30._24_4_ * 0.00012207031 * auVar81._24_4_ +
                            auVar146._24_4_ * auVar31._24_4_ * 0.00012207031 +
                            auVar33._24_4_ * auVar32._24_4_ * 0.00012207031;
              fStack_11c4 = auVar30._28_4_ + auVar31._28_4_ + auVar33._28_4_;
              auVar83._16_16_ = auVar92;
              auVar83._0_16_ = auVar100;
              auVar96._8_4_ = 0x7f800000;
              auVar96._0_8_ = 0x7f8000007f800000;
              auVar96._12_4_ = 0x7f800000;
              auVar96._16_4_ = 0x7f800000;
              auVar96._20_4_ = 0x7f800000;
              auVar96._24_4_ = 0x7f800000;
              auVar96._28_4_ = 0x7f800000;
              auVar85 = ZEXT3264(local_13c0);
              auVar146 = vblendvps_avx(auVar96,local_13c0,auVar83);
              auVar81 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar81 = vminps_avx(auVar146,auVar81);
              auVar144 = vshufpd_avx(auVar81,auVar81,5);
              auVar81 = vminps_avx(auVar81,auVar144);
              auVar144 = vperm2f128_avx(auVar81,auVar81,1);
              auVar81 = vminps_avx(auVar81,auVar144);
              auVar81 = vcmpps_avx(auVar146,auVar81,0);
              auVar144 = local_1220 & auVar81;
              auVar146 = local_1220;
              if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar144 >> 0x7f,0) != '\0') ||
                    (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar144 >> 0xbf,0) != '\0') ||
                  (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar144[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar81,local_1220);
              }
              uVar70 = vmovmskps_avx(auVar146);
              uVar4 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar68 = (ulong)uVar4;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar74->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar77 = local_1200[uVar68];
                fVar86 = local_11e0[uVar68];
                uVar1 = *(undefined4 *)(local_11a0 + uVar68 * 4);
                uVar3 = *(undefined4 *)(local_1180 + uVar68 * 4);
                uVar5 = *(undefined4 *)(local_1160 + uVar68 * 4);
                auVar143 = ZEXT416(*(uint *)(local_11c0 + uVar68 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_11c0 + uVar68 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar5;
                *(float *)(ray + k * 4 + 0xf0) = fVar77;
                *(float *)(ray + k * 4 + 0x100) = fVar86;
                *(uint *)(ray + k * 4 + 0x110) = uVar66;
                *(uint *)(ray + k * 4 + 0x120) = uVar65;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                auVar143 = vpshufd_avx(ZEXT416(uVar65),0);
                local_13e0 = ZEXT1632(auVar143);
                local_12e0 = vpshufd_avx(ZEXT416(uVar66),0);
                auStack_12d0 = auVar84._16_16_;
                auStack_12f0 = auVar97._16_16_;
                local_1300 = *local_1358;
                auVar133 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                auStack_1318 = auVar34._8_24_;
                local_1320 = pGVar74;
                local_13a0 = auVar154;
                local_12c0 = local_1220;
                while( true ) {
                  local_1100 = local_1200[uVar68];
                  local_10f0 = local_11e0[uVar68];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar68 * 4);
                  local_1350.context = context->user;
                  local_1130 = *(undefined4 *)(local_11a0 + uVar68 * 4);
                  uVar1 = *(undefined4 *)(local_1180 + uVar68 * 4);
                  auVar111._4_4_ = uVar1;
                  auVar111._0_4_ = uVar1;
                  auVar111._8_4_ = uVar1;
                  auVar111._12_4_ = uVar1;
                  local_1110 = *(undefined4 *)(local_1160 + uVar68 * 4);
                  uStack_112c = local_1130;
                  uStack_1128 = local_1130;
                  uStack_1124 = local_1130;
                  local_1120 = auVar111;
                  uStack_110c = local_1110;
                  uStack_1108 = local_1110;
                  uStack_1104 = local_1110;
                  fStack_10fc = local_1100;
                  fStack_10f8 = local_1100;
                  fStack_10f4 = local_1100;
                  fStack_10ec = local_10f0;
                  fStack_10e8 = local_10f0;
                  fStack_10e4 = local_10f0;
                  local_10e0 = local_12e0._0_8_;
                  uStack_10d8 = local_12e0._8_8_;
                  local_10d0 = local_13e0._0_16_;
                  vcmpps_avx(ZEXT1632(local_13e0._0_16_),ZEXT1632(local_13e0._0_16_),0xf);
                  uStack_10bc = (local_1350.context)->instID[0];
                  local_10c0 = uStack_10bc;
                  uStack_10b8 = uStack_10bc;
                  uStack_10b4 = uStack_10bc;
                  uStack_10b0 = (local_1350.context)->instPrimID[0];
                  uStack_10ac = uStack_10b0;
                  uStack_10a8 = uStack_10b0;
                  uStack_10a4 = uStack_10b0;
                  local_1370 = local_1300;
                  local_1350.valid = (int *)local_1370;
                  local_1350.geometryUserPtr = pGVar74->userPtr;
                  local_1350.hit = (RTCHitN *)&local_1130;
                  local_1350.N = 4;
                  auVar143 = auVar133._0_16_;
                  local_13a0._0_8_ = uVar68;
                  local_1350.ray = (RTCRayN *)ray;
                  if (pGVar74->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar74->intersectionFilterN)(&local_1350);
                    auVar133 = ZEXT1664(auVar143);
                    auVar85 = ZEXT3264(local_13c0);
                    uVar68 = local_13a0._0_8_;
                    pGVar74 = local_1320;
                  }
                  if (local_1370 == (undefined1  [16])0x0) {
                    auVar143 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                    auVar143 = auVar143 ^ auVar92;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    auVar92 = vpcmpeqd_avx(auVar111,auVar111);
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar74->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_1350);
                      auVar133 = ZEXT1664(auVar143);
                      auVar85 = ZEXT3264(local_13c0);
                      auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                      uVar68 = local_13a0._0_8_;
                      pGVar74 = local_1320;
                    }
                    auVar100 = vpcmpeqd_avx(local_1370,_DAT_01f45a50);
                    auVar143 = auVar100 ^ auVar92;
                    if (local_1370 != (undefined1  [16])0x0) {
                      auVar100 = auVar100 ^ auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])local_1350.hit);
                      *(undefined1 (*) [16])(local_1350.ray + 0xc0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x10));
                      *(undefined1 (*) [16])(local_1350.ray + 0xd0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x20));
                      *(undefined1 (*) [16])(local_1350.ray + 0xe0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x30));
                      *(undefined1 (*) [16])(local_1350.ray + 0xf0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x40));
                      *(undefined1 (*) [16])(local_1350.ray + 0x100) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x50));
                      *(undefined1 (*) [16])(local_1350.ray + 0x110) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x60));
                      *(undefined1 (*) [16])(local_1350.ray + 0x120) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x70));
                      *(undefined1 (*) [16])(local_1350.ray + 0x130) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                         (local_1350.hit + 0x80));
                      *(undefined1 (*) [16])(local_1350.ray + 0x140) = auVar92;
                    }
                  }
                  auVar93._8_8_ = 0x100000001;
                  auVar93._0_8_ = 0x100000001;
                  if ((auVar93 & auVar143) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar133._0_4_;
                  }
                  else {
                    auVar133 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_12c0 + uVar68 * 4) = 0;
                  auVar143 = auVar133._0_16_;
                  auVar92 = vshufps_avx(auVar143,auVar143,0);
                  auVar84._16_16_ = auVar92;
                  auVar84._0_16_ = auVar92;
                  auVar81 = vcmpps_avx(auVar85._0_32_,auVar84,2);
                  auVar146 = vandps_avx(auVar81,local_12c0);
                  local_12c0 = local_12c0 & auVar81;
                  if ((((((((local_12c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_12c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_12c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_12c0 >> 0x7f,0) == '\0') &&
                        (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_12c0 >> 0xbf,0) == '\0') &&
                      (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_12c0[0x1f]) break;
                  auVar97._8_4_ = 0x7f800000;
                  auVar97._0_8_ = 0x7f8000007f800000;
                  auVar97._12_4_ = 0x7f800000;
                  auVar97._16_4_ = 0x7f800000;
                  auVar97._20_4_ = 0x7f800000;
                  auVar97._24_4_ = 0x7f800000;
                  auVar97._28_4_ = 0x7f800000;
                  auVar81 = vblendvps_avx(auVar97,auVar85._0_32_,auVar146);
                  auVar144 = vshufps_avx(auVar81,auVar81,0xb1);
                  auVar144 = vminps_avx(auVar81,auVar144);
                  auVar130 = vshufpd_avx(auVar144,auVar144,5);
                  auVar144 = vminps_avx(auVar144,auVar130);
                  auVar130 = vperm2f128_avx(auVar144,auVar144,1);
                  auVar144 = vminps_avx(auVar144,auVar130);
                  auVar144 = vcmpps_avx(auVar81,auVar144,0);
                  auVar130 = auVar146 & auVar144;
                  auVar81 = auVar146;
                  if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar130 >> 0x7f,0) != '\0') ||
                        (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0xbf,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar130[0x1f] < '\0') {
                    auVar81 = vandps_avx(auVar144,auVar146);
                  }
                  uVar66 = vmovmskps_avx(auVar81);
                  uVar65 = 0;
                  if (uVar66 != 0) {
                    for (; (uVar66 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
                    }
                  }
                  uVar68 = (ulong)uVar65;
                  local_12c0 = auVar146;
                }
              }
            }
          }
        }
      }
      auVar143 = vshufps_avx(auVar143,auVar143,0);
      auVar85 = ZEXT1664(auVar143);
      auVar133 = ZEXT1664(local_1380);
    }
    else {
      pGVar69 = (GridSOA *)(uVar68 & 0xfffffffffffffff0);
      lVar8 = *(long *)(pGVar69->data + pGVar69->rootOffset);
      (pre->super_Precalculations).grid = pGVar69;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar85 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      if (lVar8 != 0) {
        *(long *)*pauVar76 = lVar8;
        *(undefined4 *)(*pauVar76 + 8) = 0;
        pauVar76 = pauVar76 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }